

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

FSerializer * Serialize(FSerializer *arc,char *key,DObject **value,DObject **param_4,bool *retcode)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  Value *this;
  DObject **ppDVar5;
  int index;
  Value *val;
  int *pndx;
  bool *pbStack_38;
  int ndx;
  bool *retcode_local;
  DObject **param_3_local;
  DObject **value_local;
  char *key_local;
  FSerializer *arc_local;
  
  if (retcode != (bool *)0x0) {
    *retcode = true;
  }
  pbStack_38 = retcode;
  retcode_local = (bool *)param_4;
  param_3_local = value;
  value_local = (DObject **)key;
  key_local = (char *)arc;
  bVar1 = FSerializer::isWriting(arc);
  if (bVar1) {
    if (*param_3_local == (DObject *)0x0) {
      bVar1 = FWriter::inObject(*(FWriter **)key_local);
      if (!bVar1) {
        FWriter::Null(*(FWriter **)key_local);
      }
    }
    else {
      if ((PClass *)*param_3_local == AWeapon::RegistrationInfo.MyClass) {
        pndx._4_4_ = 0xffffffff;
      }
      else {
        if (((*param_3_local)->ObjectFlags & 0x820) != 0) {
          return (FSerializer *)key_local;
        }
        puVar4 = (uint *)TMap<DObject_*,_int,_THashTraits<DObject_*>,_TValueTraits<int>_>::CheckKey
                                   ((TMap<DObject_*,_int,_THashTraits<DObject_*>,_TValueTraits<int>_>
                                     *)(*(long *)key_local + 0x60),*param_3_local);
        if (puVar4 == (uint *)0x0) {
          uVar3 = TArray<DObject_*,_DObject_*>::Push
                            ((TArray<DObject_*,_DObject_*> *)(*(long *)key_local + 0x50),
                             param_3_local);
          pndx._4_4_ = uVar3;
          puVar4 = (uint *)TMap<DObject_*,_int,_THashTraits<DObject_*>,_TValueTraits<int>_>::
                           operator[]((TMap<DObject_*,_int,_THashTraits<DObject_*>,_TValueTraits<int>_>
                                       *)(*(long *)key_local + 0x60),*param_3_local);
          *puVar4 = uVar3;
        }
        else {
          pndx._4_4_ = *puVar4;
        }
      }
      Serialize((FSerializer *)key_local,(char *)value_local,(int32_t *)((long)&pndx + 4),
                (int32_t *)0x0);
    }
  }
  else {
    if ((*(byte *)(*(long *)(key_local + 8) + 0xb0) & 1) == 0) {
      __assert_fail("false && \"Attempt to read object reference without calling ReadObjects first\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                    ,0x657,
                    "FSerializer &Serialize(FSerializer &, const char *, DObject *&, DObject **, bool *)"
                   );
    }
    this = FReader::FindKey(*(FReader **)(key_local + 8),(char *)value_local);
    if (this != (Value *)0x0) {
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsNull(this);
      if (bVar1) {
        *param_3_local = (DObject *)0x0;
        return (FSerializer *)key_local;
      }
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsInt(this);
      if (bVar1) {
        iVar2 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetInt(this);
        if (iVar2 == -1) {
          *param_3_local = (DObject *)AWeapon::RegistrationInfo.MyClass;
        }
        else {
          bVar1 = false;
          if (-1 < iVar2) {
            uVar3 = TArray<DObject_*,_DObject_*>::Size
                              ((TArray<DObject_*,_DObject_*> *)(*(long *)(key_local + 8) + 0x78));
            bVar1 = iVar2 < (int)uVar3;
          }
          if (!bVar1) {
            __assert_fail("index >= 0 && index < (int)arc.r->mDObjects.Size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                          ,0x66b,
                          "FSerializer &Serialize(FSerializer &, const char *, DObject *&, DObject **, bool *)"
                         );
          }
          if ((iVar2 < 0) ||
             (uVar3 = TArray<DObject_*,_DObject_*>::Size
                                ((TArray<DObject_*,_DObject_*> *)(*(long *)(key_local + 8) + 0x78)),
             (int)uVar3 <= iVar2)) {
            __assert_fail("false && \"invalid object reference\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                          ,0x672,
                          "FSerializer &Serialize(FSerializer &, const char *, DObject *&, DObject **, bool *)"
                         );
          }
          ppDVar5 = TArray<DObject_*,_DObject_*>::operator[]
                              ((TArray<DObject_*,_DObject_*> *)(*(long *)(key_local + 8) + 0x78),
                               (long)iVar2);
          *param_3_local = *ppDVar5;
        }
        return (FSerializer *)key_local;
      }
    }
    if (pbStack_38 == (bool *)0x0) {
      *param_3_local = (DObject *)0x0;
    }
    else {
      *pbStack_38 = false;
    }
  }
  return (FSerializer *)key_local;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, DObject *&value, DObject ** /*defval*/, bool *retcode)
{
	if (retcode) *retcode = true;
	if (arc.isWriting())
	{
		if (value != nullptr)
		{
			int ndx;
			if (value == WP_NOCHANGE)
			{
				ndx = -1;
			}
			else if (value->ObjectFlags & (OF_EuthanizeMe | OF_Transient))
			{
				return arc;
			}
			else
			{
				int *pndx = arc.w->mObjectMap.CheckKey(value);
				if (pndx != nullptr)
				{
					ndx = *pndx;
				}
				else
				{
					ndx = arc.w->mDObjects.Push(value);
					arc.w->mObjectMap[value] = ndx;
				}
			}
			Serialize(arc, key, ndx, nullptr);
		}
		else if (!arc.w->inObject())
		{
			arc.w->Null();
		}
	}
	else
	{
		if (!arc.r->mObjectsRead)
		{
			// If you want to read objects, you MUST call ReadObjects first, even if there's only nullptr's.
			assert(false && "Attempt to read object reference without calling ReadObjects first");
			I_Error("Attempt to read object reference without calling ReadObjects first");
		}
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			if (val->IsNull())
			{
				value = nullptr;
				return arc;
			}
			else if (val->IsInt())
			{
				int index = val->GetInt();
				if (index == -1)
				{
					value = WP_NOCHANGE;
				}
				else
				{
					assert(index >= 0 && index < (int)arc.r->mDObjects.Size());
					if (index >= 0 && index < (int)arc.r->mDObjects.Size())
					{
						value = arc.r->mDObjects[index];
					}
					else
					{
						assert(false && "invalid object reference");
						Printf(TEXTCOLOR_RED "Invalid object reference for '%s'", key);
						value = nullptr;
						arc.mErrors++;
						if (retcode) *retcode = false;
					}
				}
				return arc;
			}
		}
		if (!retcode)
		{
			value = nullptr;
		}
		else
		{
			*retcode = false;
		}
	}
	return arc;
}